

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9CachePolicyULT.cpp
# Opt level: O2

void __thiscall CTestGen9CachePolicy::CheckLlcEdramCachePolicy(CTestGen9CachePolicy *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  undefined1 local_90 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t local_60;
  uint32_t TargetCache_ELLC;
  uint32_t TargetCache_LLC;
  uint32_t TargetCache_LLC_ELLC;
  uint32_t LeCC_UNCACHEABLE;
  uint32_t LeCC_WB_CACHEABLE;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  ClientRequest.IsOverridenByRegkey = 0;
  local_60 = 1;
  TargetCache_ELLC = 2;
  TargetCache_LLC_ELLC = 3;
  uVar2 = 0;
  this_00 = &gtest_ar.message_;
  TargetCache_LLC = local_60;
  do {
    if (uVar2 == 0x11e) {
      return;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_90,CommonULT::pGmmULTClientContext,uVar2 & 0xffffffff);
    uVar1 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))
                      (CommonULT::pGmmULTClientContext,
                       (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 6) & 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.AOM",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": AOM is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x71,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    uVar4 = (uint)uVar1;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 0xf) & 3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.CoS",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": CoS is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x72,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 0xb) & 7;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.PFM",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": PFM is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x73,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 8) & 7;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.SCC",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": SCC is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x74,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 0xe) & 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.SCF",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": SCF is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x75,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 0x11) & 3;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.SelfSnoop",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": Self Snoop is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x76,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 7) & 1;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.ESC",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": ESC is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x77,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 0x13) & 0x1fff;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_48,"0","Mocs.LeCC.Reserved",(int *)this_00,(uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": Reserved field is non-zero");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x78,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (ulong)(ClientRequest.IDCode >> 4 & 3);
    LeCC_UNCACHEABLE = (uint)(uVar1 >> 4) & 3;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_48,"ClientRequest.AGE","Mocs.LeCC.LRUM",(unsigned_long *)this_00,
               (uint *)&LeCC_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
      std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
      std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                      ": Incorrect AGE settings");
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                 ,0x7b,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this_00);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    if ((ClientRequest.IDCode & 3) == 0) {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar4) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"LeCC_UNCACHEABLE","Mocs.LeCC.Cacheability",&TargetCache_LLC,
                 (uint *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                        ": Incorrect LLC/eDRAM cachebility setting");
        pcVar3 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                   ,0x7f,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
        goto LAB_00149e62;
      }
    }
    else {
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar4) & 0xffffffff00000003);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_48,"LeCC_WB_CACHEABLE","Mocs.LeCC.Cacheability",&TargetCache_LLC_ELLC,
                 (uint *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
        std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                        ": Incorrect LLC/eDRAM cachebility setting");
        pcVar3 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                   ,0x83,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      uVar4 = uVar4 >> 2;
      if ((ClientRequest.IDCode & 3) == 2) {
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar4) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_48,"TargetCache_ELLC","Mocs.LeCC.TargetCache",
                   &ClientRequest.IsOverridenByRegkey,(uint *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect target cache setting");
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                     ,0x8b,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
          goto LAB_00149e62;
        }
      }
      else if ((ClientRequest.IDCode & 3) == 1) {
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar4) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_48,"TargetCache_LLC","Mocs.LeCC.TargetCache",&local_60,(uint *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect target cache setting");
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                     ,0x87,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
LAB_00149e62:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&LeCC_UNCACHEABLE);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
        }
      }
      else {
        gtest_ar.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar4) & 0xffffffff00000003);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_48,"TargetCache_LLC_ELLC","Mocs.LeCC.TargetCache",&TargetCache_ELLC,
                   (uint *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect target cache setting");
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&LeCC_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9CachePolicyULT.cpp"
                     ,0x8f,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&LeCC_UNCACHEABLE,(Message *)this_00);
          goto LAB_00149e62;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

void CTestGen9CachePolicy::CheckLlcEdramCachePolicy()
{
    const uint32_t TargetCache_ELLC     = 0;
    const uint32_t TargetCache_LLC      = 1;
    const uint32_t TargetCache_LLC_ELLC = 2;

    const uint32_t LeCC_UNCACHEABLE  = 0x1;
    const uint32_t LeCC_WB_CACHEABLE = 0x3;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                     AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen9.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        // Check for unused fields
        EXPECT_EQ(0, Mocs.LeCC.AOM) << "Usage# " << Usage << ": AOM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.CoS) << "Usage# " << Usage << ": CoS is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.PFM) << "Usage# " << Usage << ": PFM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCF) << "Usage# " << Usage << ": SCF is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SelfSnoop) << "Usage# " << Usage << ": Self Snoop is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check for age
        EXPECT_EQ(ClientRequest.AGE, Mocs.LeCC.LRUM) << "Usage# " << Usage << ": Incorrect AGE settings";

        if(!ClientRequest.LLC && !ClientRequest.ELLC) // Uncached
        {
            EXPECT_EQ(LeCC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";
        }
        else
        {
            EXPECT_EQ(LeCC_WB_CACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";

            if(ClientRequest.LLC && !ClientRequest.ELLC) // LLC only
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
            else if(!ClientRequest.LLC && ClientRequest.ELLC) // eLLC only
            {
                EXPECT_EQ(TargetCache_ELLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
            else
            {
                EXPECT_EQ(TargetCache_LLC_ELLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";
            }
        }
    }
}